

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O1

QString * QNetworkDiskCachePrivate::uniqueFileName(QString *__return_storage_ptr__,QUrl *url)

{
  byte bVar1;
  int *piVar2;
  undefined8 *puVar3;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QUrl cleanUrl;
  QArrayData *local_c8;
  char16_t *pcStack_c0;
  qsizetype local_b8;
  QByteArray local_a8;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 *local_78;
  QUrl local_70;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>
  local_68;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_70.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QUrl::QUrl(&local_70,url);
  local_68.a.a.a.d.d = (Data *)0x0;
  local_68.a.a.a.d.ptr = (char16_t *)0x0;
  local_68.a.a.a.d.size = 0;
  QUrl::setPassword((QString *)&local_70,(ParsingMode)&local_68);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_68.a.a.a.d.d = (Data *)0x0;
  local_68.a.a.a.d.ptr = (char16_t *)0x0;
  local_68.a.a.a.d.size = 0;
  QUrl::setFragment((QString *)&local_70,(ParsingMode)&local_68);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_88 = 0xaaaaaaaa;
  uStack_84 = 0xaaaaaaaa;
  uStack_80 = 0xaaaaaaaa;
  uStack_7c = 0xaaaaaaaa;
  QUrl::toEncoded(&local_68,&local_70,0x1f00000);
  QVar4.m_data = (storage_type *)local_68.a.a.a.d.size;
  QVar4.m_size = (qsizetype)&local_88;
  QCryptographicHash::hash(QVar4,(Algorithm)local_68.a.a.a.d.ptr);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,1,0x10);
    }
  }
  local_a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_a8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  puVar3 = (undefined8 *)CONCAT44(uStack_7c,uStack_80);
  if (puVar3 == (undefined8 *)0x0) {
    puVar3 = &QByteArray::_empty;
  }
  QByteArray::number((longlong)&local_68,(int)*puVar3);
  QByteArray::left(&local_a8,(QByteArray *)&local_68,8);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,1,0x10);
    }
  }
  bVar1 = local_a8.d.ptr[(long)(local_a8.d.size + -1)];
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::number((uint)&local_c8,bVar1 & 0xf);
  local_68.a.a.a.d.size = local_b8;
  local_68.a.a.a.d.ptr = pcStack_c0;
  local_68.a.a.a.d.d = (Data *)local_c8;
  local_b8 = 0;
  local_c8 = (QArrayData *)0x0;
  pcStack_c0 = (char16_t *)0x0;
  local_68.a.a.b = L'/';
  local_68.a.b.m_size = local_a8.d.size;
  local_68.a.b.m_data = local_a8.d.ptr;
  local_68.b.m_size = 2;
  local_68.b.m_data = ".d";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QLatin1String>,_QLatin1String>::
  convertTo<QString>(__return_storage_ptr__,&local_68);
  if (&(local_68.a.a.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.a.a.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.a.a.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_c8 != (QArrayData *)0x0) {
    LOCK();
    (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_c8,2,0x10);
    }
  }
  if (&(local_a8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_a8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(uStack_84,local_88);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_84,local_88),1,0x10);
    }
  }
  QUrl::~QUrl(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QNetworkDiskCachePrivate::uniqueFileName(const QUrl &url)
{
    QUrl cleanUrl = url;
    cleanUrl.setPassword(QString());
    cleanUrl.setFragment(QString());

    const QByteArray hash = QCryptographicHash::hash(cleanUrl.toEncoded(), QCryptographicHash::Sha1);
    // convert sha1 to base36 form and return first 8 bytes for use as string
    const QByteArray id = QByteArray::number(*(qlonglong*)hash.data(), 36).left(8);
    // generates <one-char subdir>/<8-char filename.d>
    uint code = (uint)id.at(id.size()-1) % 16;
    QString pathFragment = QString::number(code, 16) + u'/' + QLatin1StringView(id) + CACHE_POSTFIX;

    return pathFragment;
}